

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

TemplateToken * __thiscall ctemplate::TemplateToken::ToString_abi_cxx11_(TemplateToken *this)

{
  char *pcVar1;
  ulong uVar2;
  bool bVar3;
  pointer pMVar4;
  long in_RSI;
  allocator local_89;
  string local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  ModifierInfo *local_48;
  string *modname;
  __normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
  local_38;
  const_iterator it;
  allocator local_1a;
  undefined1 local_19;
  TemplateToken *this_local;
  string *retval;
  
  local_19 = 0;
  pcVar1 = *(char **)(in_RSI + 8);
  uVar2 = *(ulong *)(in_RSI + 0x10);
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,pcVar1,uVar2,&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  local_38._M_current =
       (ModifierAndValue *)
       std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>::begin
                 ((vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                   *)(in_RSI + 0x18));
  while( true ) {
    modname = (string *)
              std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
              ::end((vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                     *)(in_RSI + 0x18));
    bVar3 = __gnu_cxx::operator!=
                      (&local_38,
                       (__normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
                        *)&modname);
    if (!bVar3) break;
    pMVar4 = __gnu_cxx::
             __normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
             ::operator->(&local_38);
    local_48 = pMVar4->modifier_info;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,":",&local_89);
    std::operator+(local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_88);
    std::__cxx11::string::operator+=((string *)this,(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    pMVar4 = __gnu_cxx::
             __normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
             ::operator->(&local_38);
    if ((pMVar4->modifier_info->is_registered & 1U) == 0) {
      std::__cxx11::string::operator+=((string *)this,"<not registered>");
    }
    __gnu_cxx::
    __normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
    ::operator++(&local_38);
  }
  return this;
}

Assistant:

string ToString() const {   // used for debugging (annotations)
    string retval(text, textlen);
    for (vector<ModifierAndValue>::const_iterator it = modvals.begin();
         it != modvals.end();  ++it) {
      const string& modname = it->modifier_info->long_name;
      retval += string(":") + modname;
      if (!it->modifier_info->is_registered)
        retval += "<not registered>";
    }
    return retval;
  }